

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O3

void __thiscall kj::_::Debug::Fault::fatal(Fault *this)

{
  Exception *pEVar1;
  Exception local_168;
  
  pEVar1 = this->exception;
  local_168.ownFile.content.ptr = (pEVar1->ownFile).content.ptr;
  local_168.ownFile.content.size_ = (pEVar1->ownFile).content.size_;
  local_168.ownFile.content.disposer = (pEVar1->ownFile).content.disposer;
  (pEVar1->ownFile).content.ptr = (char *)0x0;
  (pEVar1->ownFile).content.size_ = 0;
  local_168.file = pEVar1->file;
  local_168.line = pEVar1->line;
  local_168.type = pEVar1->type;
  local_168.description.content.ptr = (pEVar1->description).content.ptr;
  local_168.description.content.size_ = (pEVar1->description).content.size_;
  (pEVar1->description).content.ptr = (char *)0x0;
  (pEVar1->description).content.size_ = 0;
  local_168.description.content.disposer = (pEVar1->description).content.disposer;
  local_168.context.ptr.disposer = (pEVar1->context).ptr.disposer;
  local_168.context.ptr.ptr = (pEVar1->context).ptr.ptr;
  (pEVar1->context).ptr.ptr = (Context *)0x0;
  memcpy(local_168.trace,pEVar1->trace,0x104);
  pEVar1 = this->exception;
  if (pEVar1 != (Exception *)0x0) {
    Exception::~Exception(pEVar1);
  }
  operator_delete(pEVar1,0x158);
  this->exception = (Exception *)0x0;
  throwFatalException(&local_168,2);
}

Assistant:

void Debug::Fault::fatal() {
  Exception copy = mv(*exception);
  delete exception;
  exception = nullptr;
  throwFatalException(mv(copy), 2);
  abort();
}